

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O0

void __thiscall fc_layer_t::fc_layer_t(fc_layer_t *this,tdsize in_size,int out_size)

{
  int iVar1;
  int iVar2;
  allocator_type *__a;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  vector<float,_std::allocator<float>_> *this_00;
  float _y;
  int h;
  int i;
  int maxval;
  float _x;
  tensor_t<float> *in_stack_fffffffffffffeb0;
  vector<float,_std::allocator<float>_> *__x;
  allocator_type *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  undefined1 *__n;
  tensor_t<float> *in_stack_fffffffffffffed0;
  tensor_t<float> *in_stack_fffffffffffffed8;
  tensor_t<float> *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  layer_type type;
  layer_t *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  int iVar3;
  undefined4 in_stack_ffffffffffffff04;
  int iVar4;
  undefined1 local_f1 [33];
  vector<float,_std::allocator<float>_> local_d0 [6];
  int local_2c;
  undefined8 local_10;
  int local_8;
  
  type = (layer_type)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_2c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_EDX;
  tensor_t<float>::tensor_t
            ((tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  tensor_t<float>::tensor_t
            ((tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  tensor_t<float>::tensor_t
            ((tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  layer_t::layer_t(in_stack_fffffffffffffef0,type,in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x103659);
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x103666);
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x103673);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x103686);
  tensor_t<float>::tensor_t
            ((tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)(in_RDI + 0x94) >> 0x20));
  this_00 = (vector<float,_std::allocator<float>_> *)(in_RDI + 0xbc);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::vector
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)0x1036db);
  std::allocator<float>::allocator((allocator<float> *)0x1036fa);
  std::vector<float,_std::allocator<float>_>::vector
            (this_00,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  __x = local_d0;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffec0,__x);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffec0);
  std::allocator<float>::~allocator((allocator<float> *)0x103745);
  __a = (allocator_type *)(long)local_2c;
  __n = local_f1;
  std::allocator<gradient_t>::allocator((allocator<gradient_t> *)0x103761);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::vector
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)this_00,(size_type)__n,__a);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::operator=
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)__a,
             (vector<gradient_t,_std::allocator<gradient_t>_> *)__x);
  std::vector<gradient_t,_std::allocator<gradient_t>_>::~vector
            ((vector<gradient_t,_std::allocator<gradient_t>_> *)__a);
  std::allocator<gradient_t>::~allocator((allocator<gradient_t> *)0x1037a1);
  iVar1 = (int)local_10 * local_10._4_4_ * local_8;
  for (iVar4 = 0; iVar4 < local_2c; iVar4 = iVar4 + 1) {
    for (iVar3 = 0; iVar3 < (int)local_10 * local_10._4_4_ * local_8; iVar3 = iVar3 + 1) {
      _y = 2.19722 / (float)iVar1;
      iVar2 = rand();
      _x = _y * (float)iVar2 * 4.656613e-10;
      in_stack_fffffffffffffeb0 =
           (tensor_t<float> *)
           tensor_t<float>::operator()(in_stack_fffffffffffffeb0,(int)_x,(int)_y,0);
      *(float *)&(in_stack_fffffffffffffeb0->data).super__Vector_base<float,_std::allocator<float>_>
                 ._M_impl.super__Vector_impl_data._M_start = _x;
    }
  }
  return;
}

Assistant:

fc_layer_t(tdsize in_size, int out_size) :
      layer_t(layer_type::fc,
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(out_size, 1, 1)), weights(in_size.x * in_size.y * in_size.z, out_size, 1) {
    input = std::vector<float>(static_cast<unsigned long>(out_size));
    gradients = std::vector<gradient_t>(static_cast<unsigned long>(out_size));

    int maxval = in_size.x * in_size.y * in_size.z;

    // weight initialization
    for (int i = 0; i < out_size; i++)
      for (int h = 0; h < in_size.x * in_size.y * in_size.z; h++)
        weights(h, i, 0) = 2.19722f / maxval * rand() / float(RAND_MAX);
    // 2.19722f = f^-1(0.9) => x where [1 / (1 + exp(-x) ) = 0.9]
  }